

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O1

TestCaseGroup * deqp::gles31::Functional::createTextureBufferTests(Context *context)

{
  RenderBits RVar1;
  ModifyBits MVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  TestCaseGroup *this;
  TestNode *pTVar5;
  TestNode *pTVar6;
  long *plVar7;
  TextureBufferCase *pTVar8;
  size_type *psVar9;
  long *plVar10;
  RenderBits renderBits;
  RenderBits renderBits_00;
  ModifyBits modifyBits;
  ModifyBits modifyBits_00;
  ModifyBits modifyBits_01;
  ModifyBits modifyBits_02;
  RenderBits renderBits_01;
  RenderBits renderBits_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar11;
  int sizeNdx;
  long lVar12;
  long lVar13;
  string name;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  TestNode *local_250;
  TestCaseGroup *local_248;
  TestNode *local_240;
  long *local_238 [2];
  long local_228 [2];
  size_t bufferSizes [5];
  ostringstream s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [6];
  ios_base local_180 [264];
  RenderBits renderTypeCombinations [15];
  
  this = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"texture_buffer",
             "Texture buffer syncronization tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  this->m_context = context;
  bufferSizes[0] = 0x200;
  bufferSizes[1] = 0x201;
  bufferSizes[2] = 0x10000;
  bufferSizes[3] = 0x10001;
  bufferSizes[4] = 0x1ffff;
  renderTypeCombinations[0] = RENDERBITS_AS_VERTEX_ARRAY;
  renderTypeCombinations[1] = RENDERBITS_AS_INDEX_ARRAY;
  renderTypeCombinations[2] = RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY;
  renderTypeCombinations[3] = RENDERBITS_AS_VERTEX_TEXTURE;
  renderTypeCombinations[4] = RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  renderTypeCombinations[5] = RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  renderTypeCombinations[6] =
       RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY;
  renderTypeCombinations[7] = RENDERBITS_AS_FRAGMENT_TEXTURE;
  renderTypeCombinations[8] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  renderTypeCombinations[9] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  renderTypeCombinations[10] =
       RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY;
  renderTypeCombinations[0xb] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE;
  renderTypeCombinations[0xc] =
       RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  renderTypeCombinations[0xd] =
       RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  renderTypeCombinations[0xe] =
       RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY|
       RENDERBITS_AS_VERTEX_ARRAY;
  pTVar5 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,context->m_testCtx,"state_query","Query states and limits");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar5[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar6 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"max_texture_buffer_size_getboolean",
             "Test MAX_TEXTURE_BUFFER_SIZE");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57ab0;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000008c2b;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"max_texture_buffer_size_getinteger",
             "Test MAX_TEXTURE_BUFFER_SIZE");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57ab0;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000008c2b;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 3;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"max_texture_buffer_size_getinteger64",
             "Test MAX_TEXTURE_BUFFER_SIZE");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57ab0;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000008c2b;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 4;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"max_texture_buffer_size_getfloat",
             "Test MAX_TEXTURE_BUFFER_SIZE");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57ab0;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000008c2b;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_offset_alignment_getboolean",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57b00;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000919f;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_offset_alignment_getinteger",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57b00;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000919f;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 3;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_offset_alignment_getinteger64",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57b00;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000919f;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 4;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_offset_alignment_getfloat",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57b00;
  pTVar6[1].m_testCtx = (TestContext *)0x1000000919f;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_binding_getboolean",
             "TEXTURE_BUFFER_BINDING");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57b50;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_binding_getinteger",
             "TEXTURE_BUFFER_BINDING");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57b50;
  *(undefined4 *)&pTVar6[1].m_testCtx = 3;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_binding_getinteger64",
             "TEXTURE_BUFFER_BINDING");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57b50;
  *(undefined4 *)&pTVar6[1].m_testCtx = 4;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_binding_getfloat",
             "TEXTURE_BUFFER_BINDING");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57b50;
  *(undefined4 *)&pTVar6[1].m_testCtx = 5;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_binding_buffer_getboolean",
             "TEXTURE_BINDING_BUFFER");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57ba0;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_binding_buffer_getinteger",
             "TEXTURE_BINDING_BUFFER");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57ba0;
  *(undefined4 *)&pTVar6[1].m_testCtx = 3;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_binding_buffer_getinteger64",
             "TEXTURE_BINDING_BUFFER");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57ba0;
  *(undefined4 *)&pTVar6[1].m_testCtx = 4;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_binding_buffer_getfloat",
             "TEXTURE_BINDING_BUFFER");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57ba0;
  *(undefined4 *)&pTVar6[1].m_testCtx = 5;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_data_store_binding_integer",
             "TEXTURE_BUFFER_DATA_STORE_BINDING");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57bf0;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0x1d;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_data_store_binding_float",
             "TEXTURE_BUFFER_DATA_STORE_BINDING");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57bf0;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0x1e;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_offset_integer",
             "TEXTURE_BUFFER_OFFSET");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57c40;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0x1d;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_offset_float",
             "TEXTURE_BUFFER_OFFSET");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57c40;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0x1e;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_size_integer",
             "TEXTURE_BUFFER_SIZE");
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57c90;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0x1d;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,context->m_testCtx,"texture_buffer_size_float","TEXTURE_BUFFER_SIZE"
            );
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b57c90;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0x1e;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar5 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,context->m_testCtx,"render",
             "Setup texture buffer with glBufferData and render data in different ways");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar5[1]._vptr_TestNode = (_func_int **)context;
  local_248 = this;
  local_240 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar12 = 0;
  do {
    RVar1 = renderTypeCombinations[lVar12];
    local_250 = (TestNode *)lVar12;
    pTVar5 = (TestNode *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&s,(_anonymous_namespace_ *)(ulong)RVar1,renderBits);
    _Var4._M_p = _s;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_00);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,context->m_testCtx,_Var4._M_p,name._M_dataplus._M_p);
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
    pTVar5[1]._vptr_TestNode = (_func_int **)context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != local_1e0) {
      operator_delete(_s,local_1e0[0]._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(local_240,pTVar5);
    lVar12 = 0;
    do {
      sVar3 = bufferSizes[lVar12];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_180);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x992d79);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        name.field_2._M_allocated_capacity = *psVar9;
        name.field_2._8_8_ = plVar7[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar9;
        name._M_dataplus._M_p = (pointer)*plVar7;
      }
      name._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      pTVar8 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar8,context->m_testCtx,context->m_renderCtx,0x8058,sVar3,0,0,RENDERBITS_NONE,
                 MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 5);
    lVar12 = 0;
    do {
      sVar3 = *(size_t *)((long)&DAT_009c16a0 + lVar12);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_180);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x9c13cf);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        name.field_2._M_allocated_capacity = *psVar9;
        name.field_2._8_8_ = plVar7[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar9;
        name._M_dataplus._M_p = (pointer)*plVar7;
      }
      name._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      pTVar8 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar8,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,0,sVar3,
                 RENDERBITS_NONE,MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x20);
    lVar12 = 0;
    do {
      sVar3 = *(size_t *)((long)&DAT_009c1020 + lVar12);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_180);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0x990c32);
      local_270 = &local_260;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_260 = *plVar10;
        lStack_258 = plVar7[3];
      }
      else {
        local_260 = *plVar10;
        local_270 = (long *)*plVar7;
      }
      local_268 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        name.field_2._M_allocated_capacity = *psVar9;
        name.field_2._8_8_ = plVar7[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar9;
        name._M_dataplus._M_p = (pointer)*plVar7;
      }
      name._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      pTVar8 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar8,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,sVar3,0x10001,
                 RENDERBITS_NONE,MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar12 = lVar12 + 8;
    } while (lVar12 == 8);
    lVar12 = (long)local_250 + 1;
  } while (lVar12 != 0xf);
  pTVar5 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,context->m_testCtx,"modify",
             "Modify texture buffer content in multiple ways");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar5[1]._vptr_TestNode = (_func_int **)context;
  local_240 = pTVar5;
  tcu::TestNode::addChild((TestNode *)local_248,pTVar5);
  lVar12 = 0;
  do {
    MVar2 = (&DAT_009c1030)[lVar12];
    local_250 = (TestNode *)lVar12;
    pTVar5 = (TestNode *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&s,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits);
    _Var4._M_p = _s;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_00);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,context->m_testCtx,_Var4._M_p,name._M_dataplus._M_p);
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
    pTVar5[1]._vptr_TestNode = (_func_int **)context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != local_1e0) {
      operator_delete(_s,local_1e0[0]._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(local_240,pTVar5);
    lVar12 = 0;
    do {
      sVar3 = bufferSizes[lVar12];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_180);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x992d79);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        name.field_2._M_allocated_capacity = *psVar9;
        name.field_2._8_8_ = plVar7[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar9;
        name._M_dataplus._M_p = (pointer)*plVar7;
      }
      name._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      pTVar8 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar8,context->m_testCtx,context->m_renderCtx,0x8058,sVar3,0,0,RENDERBITS_NONE,
                 MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 5);
    lVar12 = 0;
    do {
      sVar3 = *(size_t *)((long)&DAT_009c16a0 + lVar12);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_180);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x9c13cf);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        name.field_2._M_allocated_capacity = *psVar9;
        name.field_2._8_8_ = plVar7[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar9;
        name._M_dataplus._M_p = (pointer)*plVar7;
      }
      name._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      pTVar8 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar8,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,0,sVar3,
                 RENDERBITS_NONE,MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,
                 name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x20);
    lVar12 = 0;
    do {
      sVar3 = *(size_t *)((long)&DAT_009c1020 + lVar12);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_180);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0x990c32);
      local_270 = &local_260;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_260 = *plVar10;
        lStack_258 = plVar7[3];
      }
      else {
        local_260 = *plVar10;
        local_270 = (long *)*plVar7;
      }
      local_268 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        name.field_2._M_allocated_capacity = *psVar9;
        name.field_2._8_8_ = plVar7[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar9;
        name._M_dataplus._M_p = (pointer)*plVar7;
      }
      name._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      pTVar8 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar8,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,sVar3,0x10001,
                 RENDERBITS_NONE,MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,
                 name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar12 = lVar12 + 8;
    } while (lVar12 == 8);
    lVar12 = (long)local_250 + 1;
  } while (lVar12 != 4);
  pTVar5 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,context->m_testCtx,"modify_render",
             "Modify texture buffer content in multiple ways and render in different ways");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar5[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)local_248,pTVar5);
  lVar12 = 0;
  local_250 = pTVar5;
  do {
    pTVar5 = local_250;
    MVar2 = (&DAT_009c1030)[lVar12];
    pTVar6 = (TestNode *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&s,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_01);
    _Var4._M_p = _s;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_02);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,context->m_testCtx,_Var4._M_p,name._M_dataplus._M_p);
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
    pTVar6[1]._vptr_TestNode = (_func_int **)context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != local_1e0) {
      operator_delete(_s,local_1e0[0]._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar13 = 0;
    uVar11 = extraout_RDX;
    do {
      RVar1 = renderTypeCombinations[lVar13];
      (anonymous_namespace)::toTestName_abi_cxx11_
                ((string *)&s,(_anonymous_namespace_ *)(ulong)RVar1,(RenderBits)uVar11);
      pTVar8 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar8,context->m_testCtx,context->m_renderCtx,0x8058,0x4000,0,0,RENDERBITS_NONE,
                 MVar2,RVar1,_s,_s);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
      uVar11 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != local_1e0) {
        operator_delete(_s,local_1e0[0]._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_01;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0xf);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  pTVar5 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,context->m_testCtx,"render_modify",
             "Render texture buffer and modify.");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar5[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)local_248,pTVar5);
  lVar12 = 0;
  local_250 = pTVar5;
  do {
    pTVar5 = local_250;
    RVar1 = renderTypeCombinations[lVar12];
    pTVar6 = (TestNode *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&s,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_01);
    _Var4._M_p = _s;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_02);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,context->m_testCtx,_Var4._M_p,name._M_dataplus._M_p);
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
    pTVar6[1]._vptr_TestNode = (_func_int **)context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != local_1e0) {
      operator_delete(_s,local_1e0[0]._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar13 = 0;
    uVar11 = extraout_RDX_02;
    do {
      MVar2 = *(ModifyBits *)((long)&DAT_009c1030 + lVar13);
      (anonymous_namespace)::toTestName_abi_cxx11_
                ((string *)&s,(_anonymous_namespace_ *)(ulong)MVar2,(ModifyBits)uVar11);
      pTVar8 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar8,context->m_testCtx,context->m_renderCtx,0x8058,0x4000,0,0,RVar1,MVar2,
                 RENDERBITS_AS_FRAGMENT_TEXTURE,_s,_s);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
      uVar11 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != local_1e0) {
        operator_delete(_s,local_1e0[0]._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_04;
      }
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x10);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xf);
  return local_248;
}

Assistant:

TestCaseGroup* createTextureBufferTests (Context& context)
{
	TestCaseGroup* const root = new TestCaseGroup(context, "texture_buffer", "Texture buffer syncronization tests");

	const size_t bufferSizes[] =
	{
		512,
		513,
		65536,
		65537,
		131071
	};

	const size_t rangeSizes[] =
	{
		512,
		513,
		65537,
		98304,
	};

	const size_t offsets[] =
	{
		1,
		7
	};

	const RenderBits renderTypeCombinations[] =
	{
		RENDERBITS_AS_VERTEX_ARRAY,
									  RENDERBITS_AS_INDEX_ARRAY,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY,

																  RENDERBITS_AS_VERTEX_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|							  RENDERBITS_AS_VERTEX_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE,

																								  RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|															  RENDERBITS_AS_FRAGMENT_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY |								  RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY |								  RENDERBITS_AS_FRAGMENT_TEXTURE,
																  RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|							  RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE
	};

	const ModifyBits modifyTypes[] =
	{
		MODIFYBITS_BUFFERDATA,
		MODIFYBITS_BUFFERSUBDATA,
		MODIFYBITS_MAPBUFFER_WRITE,
		MODIFYBITS_MAPBUFFER_READWRITE
	};

	// State and limit queries
	{
		TestCaseGroup* const queryGroup = new TestCaseGroup(context, "state_query", "Query states and limits");
		root->addChild(queryGroup);

		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getboolean",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_BOOLEAN));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getinteger",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_INTEGER));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getinteger64",			"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_INTEGER64));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getfloat",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_FLOAT));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getboolean",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_BOOLEAN));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getinteger",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_INTEGER));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getinteger64",	"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_INTEGER64));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getfloat",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_FLOAT));

		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getboolean",	"TEXTURE_BUFFER_BINDING", QUERY_BOOLEAN));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getinteger",	"TEXTURE_BUFFER_BINDING", QUERY_INTEGER));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getinteger64",	"TEXTURE_BUFFER_BINDING", QUERY_INTEGER64));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getfloat",		"TEXTURE_BUFFER_BINDING", QUERY_FLOAT));

		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getboolean",	"TEXTURE_BINDING_BUFFER", QUERY_BOOLEAN));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getinteger",	"TEXTURE_BINDING_BUFFER", QUERY_INTEGER));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getinteger64",	"TEXTURE_BINDING_BUFFER", QUERY_INTEGER64));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getfloat",		"TEXTURE_BINDING_BUFFER", QUERY_FLOAT));

		queryGroup->addChild(new TextureBufferDataStoreQueryCase(context, "texture_buffer_data_store_binding_integer",	"TEXTURE_BUFFER_DATA_STORE_BINDING", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferDataStoreQueryCase(context, "texture_buffer_data_store_binding_float",	"TEXTURE_BUFFER_DATA_STORE_BINDING", QUERY_TEXTURE_LEVEL_FLOAT));

		queryGroup->addChild(new TextureBufferOffsetQueryCase(context, "texture_buffer_offset_integer",	"TEXTURE_BUFFER_OFFSET", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferOffsetQueryCase(context, "texture_buffer_offset_float",	"TEXTURE_BUFFER_OFFSET", QUERY_TEXTURE_LEVEL_FLOAT));

		queryGroup->addChild(new TextureBufferSizeQueryCase(context, "texture_buffer_size_integer",	"TEXTURE_BUFFER_SIZE", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferSizeQueryCase(context, "texture_buffer_size_float",	"TEXTURE_BUFFER_SIZE", QUERY_TEXTURE_LEVEL_FLOAT));
	}

	// Rendering test
	{
		TestCaseGroup* const renderGroup = new TestCaseGroup(context, "render", "Setup texture buffer with glBufferData and render data in different ways");
		root->addChild(renderGroup);

		for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
		{
			const RenderBits		renderType		= renderTypeCombinations[renderTypeNdx];
			TestCaseGroup* const	renderTypeGroup	= new TestCaseGroup(context, toTestName(renderType).c_str(), toTestName(renderType).c_str());

			renderGroup->addChild(renderTypeGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(bufferSizes); sizeNdx++)
			{
				const size_t size	= bufferSizes[sizeNdx];
				const string name	("buffer_size_" + de::toString(size));

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(rangeSizes); sizeNdx++)
			{
				const size_t size		= rangeSizes[sizeNdx];
				const string name		("range_size_" + de::toString(size));
				const size_t bufferSize	= 131072;

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, 0, size, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}

			for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
			{
				const size_t offset		= offsets[offsetNdx];
				const size_t bufferSize	= 131072;
				const size_t size		= 65537;
				const string name		("offset_" + de::toString(offset) + "_alignments");

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, offset, size, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}
		}
	}

	// Modify tests
	{
		TestCaseGroup* const modifyGroup = new TestCaseGroup(context, "modify", "Modify texture buffer content in multiple ways");
		root->addChild(modifyGroup);

		for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
		{
			const ModifyBits		modifyType		= modifyTypes[modifyNdx];
			TestCaseGroup* const	modifyTypeGroup	= new TestCaseGroup(context, toTestName(modifyType).c_str(), toTestName(modifyType).c_str());

			modifyGroup->addChild(modifyTypeGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(bufferSizes); sizeNdx++)
			{
				const size_t	size	= bufferSizes[sizeNdx];
				const string	name	("buffer_size_" + de::toString(size));

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(rangeSizes); sizeNdx++)
			{
				const size_t size		= rangeSizes[sizeNdx];
				const string name		("range_size_" + de::toString(size));
				const size_t bufferSize	= 131072;

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, 0, size, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}

			for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
			{
				const size_t offset		= offsets[offsetNdx];
				const size_t bufferSize	= 131072;
				const size_t size		= 65537;
				const string name		("offset_" + de::toString(offset) + "_alignments");

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, offset, size, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}
		}
	}

	// Modify-Render tests
	{
		TestCaseGroup* const modifyRenderGroup = new TestCaseGroup(context, "modify_render", "Modify texture buffer content in multiple ways and render in different ways");
		root->addChild(modifyRenderGroup);

		for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
		{
			const ModifyBits		modifyType		= modifyTypes[modifyNdx];
			TestCaseGroup* const	modifyTypeGroup	= new TestCaseGroup(context, toTestName(modifyType).c_str(), toTestName(modifyType).c_str());

			modifyRenderGroup->addChild(modifyTypeGroup);

			for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
			{
				const RenderBits	renderType	= renderTypeCombinations[renderTypeNdx];
				const size_t		size		= 16*1024;
				const string		name		(toTestName(renderType));

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, modifyType, renderType, name.c_str(), name.c_str()));
			}
		}
	}

	// Render-Modify tests
	{
		TestCaseGroup* const renderModifyGroup = new TestCaseGroup(context, "render_modify", "Render texture buffer and modify.");
		root->addChild(renderModifyGroup);

		for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
		{
			const RenderBits		renderType		= renderTypeCombinations[renderTypeNdx];
			TestCaseGroup* const	renderTypeGroup	= new TestCaseGroup(context, toTestName(renderType).c_str(), toTestName(renderType).c_str());

			renderModifyGroup->addChild(renderTypeGroup);

			for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
			{
				const ModifyBits	modifyType	= modifyTypes[modifyNdx];
				const size_t		size		= 16*1024;
				const string		name		(toTestName(modifyType));

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, renderType, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}
		}
	}

	return root;
}